

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

void __thiscall arangodb::velocypack::Builder::closeLevel(Builder *this)

{
  pointer pCVar1;
  const_iterator __last;
  ValueLength VVar2;
  
  pCVar1 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __last._M_current =
       (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  VVar2 = pCVar1[-1].indexStartPos;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = pCVar1 + -1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
            (&this->_indexes,
             (const_iterator)
             ((this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start + VVar2),__last);
  return;
}

Assistant:

void Builder::closeLevel() noexcept {
  VELOCYPACK_ASSERT(!_stack.empty());
  ValueLength const indexStartPos = _stack.back().indexStartPos;
  _stack.pop_back();
  _indexes.erase(_indexes.begin() + indexStartPos, _indexes.end());
}